

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O3

CTcSymbol * CTcSymObjBase::read_from_sym_file(CVmFile *fp)

{
  uint uVar1;
  CTcPrsSymtab *this;
  ushort *__s;
  size_t sVar2;
  CTcSymbol *pCVar3;
  CTcSymObjBase *this_00;
  char *txt;
  ushort *buf_00;
  tc_metaclass_t tVar4;
  ulong uVar5;
  char c;
  size_t sc_len;
  char buf [81];
  byte local_91;
  size_t local_90;
  ushort local_88 [48];
  
  this_00 = (CTcSymObjBase *)0x0;
  __s = (ushort *)CTcParser::read_len_prefix_str(fp,(char *)local_88,0x51,(size_t *)0x0,0x2db6);
  if (__s != (ushort *)0x0) {
    buf_00 = local_88;
    CVmFile::read_bytes(fp,(char *)buf_00,2);
    tVar4 = (tc_metaclass_t)local_88[0];
    if (local_88[0] - 1 < 2) {
      this = G_prs->global_symtab_;
      sVar2 = strlen((char *)__s);
      buf_00 = __s;
      pCVar3 = CTcPrsSymtab::find(this,(textchar_t *)__s,sVar2,(CTcPrsSymtab **)0x0);
      if (((pCVar3 != (CTcSymbol *)0x0) &&
          (*(int *)&(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
           == 2)) &&
         ((tc_metaclass_t)pCVar3[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_
          == tVar4)) {
        return pCVar3;
      }
    }
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)buf_00);
    sVar2 = strlen((char *)__s);
    uVar1 = G_cg->next_obj_;
    G_cg->next_obj_ = uVar1 + 1;
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,(char *)__s,sVar2,0);
    *(undefined4 *)
     &(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
      field_0x24 = 2;
    this_00->obj_id_ = (ulong)uVar1;
    this_00->stream_ofs_ = 0xffffffff;
    this_00->obj_stm_ = (CTPNStmObject *)0x0;
    this_00->fixups_ = (CTcIdFixup *)0x0;
    this_00->first_del_prop_ = (CTcObjPropDel *)0x0;
    this_00->mod_base_sym_ = (CTcSymObj *)0x0;
    (this_00->modifying_obj_).sym_ = (CTcSymObj *)0x0;
    this_00->metaclass_ = tVar4;
    this_00->grammar_entry_ = (CTcGramProdEntry *)0x0;
    this_00->template_head_ = (CTcObjTemplate *)0x0;
    this_00->template_tail_ = (CTcObjTemplate *)0x0;
    this_00->obj_file_idx_ = 0;
    this_00->dict_ = (CTcDictEntry *)0x0;
    this_00->vocab_ = (CTcVocabEntry *)0x0;
    this_00->sc_ = (CTcObjScEntry *)0x0;
    this_00->sc_name_head_ = (CTPNSuperclass *)0x0;
    this_00->sc_name_tail_ = (CTPNSuperclass *)0x0;
    this_00->meta_extra_ = (void *)0x0;
    *(ushort *)&this_00->field_0xb8 = ((ushort)*(undefined4 *)&this_00->field_0xb8 & 0xf000) + 1;
    (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
    _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003187b0;
    if (tVar4 == TC_META_TADSOBJ) {
      CVmFile::read_bytes(fp,(char *)&local_91,1);
      *(ushort *)&this_00->field_0xb8 =
           (local_91 & 4) << 9 |
           (ushort)((local_91 & 2) << 4) |
           (ushort)*(undefined4 *)&this_00->field_0xb8 & 0xfbdf | (ushort)((local_91 & 1) << 10);
      CVmFile::read_bytes(fp,(char *)local_88,2);
      uVar5 = (ulong)local_88[0];
      if (uVar5 != 0) {
        do {
          txt = CTcParser::read_len_prefix_str(fp,(char *)local_88,0x51,&local_90,0x2db6);
          add_sc_name_entry(this_00,txt,local_90);
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
    }
  }
  return &this_00->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcSymObjBase::read_from_sym_file(CVmFile *fp)
{
    const char *txt;
    tc_metaclass_t meta;
    CTcSymObj *sym;
    char c;
    size_t cnt;
    size_t i;

    /* read the symbol name */
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the metaclass ID */
    meta = (tc_metaclass_t)fp->read_uint2();

    /* 
     *   If it's a dictionary object, check to see if it's already defined -
     *   a dictionary object can be exported from multiple modules without
     *   error, since dictionaries are shared across modules.
     *   
     *   The same applies to grammar productions, since a grammar production
     *   can be implicitly created in multiple files.  
     */
    if (meta == TC_META_DICT || meta == TC_META_GRAMPROD)
    {
        /* look for a previous instance of the symbol */
        CTcSymbol *old_sym =
            G_prs->get_global_symtab()->find(txt, strlen(txt));
        if (old_sym != 0
            && old_sym->get_type() == TC_SYM_OBJ
            && ((CTcSymObj *)old_sym)->get_metaclass() == meta)
        {
            /* 
             *   the dictionary is already in the symbol table - return the
             *   existing one, since there's no conflict with importing the
             *   dictionary from multiple places 
             */
            return old_sym;
        }
    }

    /* create the new symbol */
    sym = new CTcSymObj(txt, strlen(txt), FALSE, G_cg->new_obj_id(),
                        TRUE, meta, 0);

    /* if the metaclass is tads-object, read additional information */
    if (meta == TC_META_TADSOBJ)
    {
        /* read the root-object-superclass flag and the class-object flag */
        fp->read_bytes(&c, 1);
        sym->set_sc_is_root((c & 1) != 0);
        sym->set_is_class((c & 2) != 0);
        if ((c & 4) != 0)
            sym->set_transient();

        /* read the number of superclasses, and read the superclass names */
        cnt = fp->read_uint2();
        for (i = 0 ; i < cnt ; ++i)
        {
            char buf[TOK_SYM_MAX_LEN + 1];
            const char *sc_txt;
            size_t sc_len;

            /* read the symbol */
            sc_txt = CTcParser::read_len_prefix_str(
                fp, buf, sizeof(buf), &sc_len, TCERR_SYMEXP_SYM_TOO_LONG);

            /* add the superclass list entry to the symbol */
            sym->add_sc_name_entry(sc_txt, sc_len);
        }
    }

    /* return the symbol */
    return sym;
}